

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O3

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateLoopContinueBreakLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string *psVar2;
  pointer pcVar3;
  bool bVar4;
  long *plVar5;
  undefined8 *puVar6;
  long *plVar7;
  ulong *puVar8;
  string err;
  long *local_e0;
  long local_d8;
  long local_d0;
  long lStack_c8;
  ulong *local_c0;
  long local_b8;
  ulong local_b0;
  long lStack_a8;
  long *local_a0 [2];
  long local_90 [2];
  undefined1 local_80 [8];
  _Alloc_hider local_78;
  undefined1 local_70 [24];
  pointer local_58;
  _Alloc_hider local_50;
  size_type local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  Result::Result((Result *)&local_58);
  validateInputCount((Result *)local_80,layer,0,0);
  local_58 = (pointer)local_80;
  std::__cxx11::string::operator=((string *)&local_50,(string *)&local_78);
  if (local_78._M_p != local_70 + 8) {
    operator_delete(local_78._M_p,local_70._8_8_ + 1);
  }
  bVar4 = Result::good((Result *)&local_58);
  if (bVar4) {
    local_b8 = 0;
    local_b0 = local_b0 & 0xffffffffffffff00;
    local_c0 = &local_b0;
    Result::Result((Result *)local_80);
    if (local_c0 != &local_b0) {
      operator_delete(local_c0,local_b0 + 1);
    }
    local_58 = (pointer)local_80;
    std::__cxx11::string::operator=((string *)&local_50,(string *)&local_78);
    if (local_78._M_p != local_70 + 8) {
      operator_delete(local_78._M_p,local_70._8_8_ + 1);
    }
  }
  bVar4 = Result::good((Result *)&local_58);
  if ((bVar4) && (this->loopStackDepth == 0)) {
    local_78._M_p = (pointer)0x0;
    local_70[0] = '\0';
    local_80 = (undefined1  [8])local_70;
    if (layer->_oneof_case_[0] == 0x26c) {
      psVar2 = (layer->name_).ptr_;
      local_a0[0] = local_90;
      pcVar3 = (psVar2->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_a0,pcVar3,pcVar3 + psVar2->_M_string_length);
      plVar5 = (long *)std::__cxx11::string::replace((ulong)local_a0,0,(char *)0x0,0x61609f);
      local_e0 = &local_d0;
      plVar7 = plVar5 + 2;
      if ((long *)*plVar5 == plVar7) {
        local_d0 = *plVar7;
        lStack_c8 = plVar5[3];
      }
      else {
        local_d0 = *plVar7;
        local_e0 = (long *)*plVar5;
      }
      local_d8 = plVar5[1];
      *plVar5 = (long)plVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_e0);
    }
    else {
      psVar2 = (layer->name_).ptr_;
      local_a0[0] = local_90;
      pcVar3 = (psVar2->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_a0,pcVar3,pcVar3 + psVar2->_M_string_length);
      puVar6 = (undefined8 *)std::__cxx11::string::replace((ulong)local_a0,0,(char *)0x0,0x6160e4);
      local_e0 = &local_d0;
      plVar5 = puVar6 + 2;
      if ((long *)*puVar6 == plVar5) {
        local_d0 = *plVar5;
        lStack_c8 = puVar6[3];
      }
      else {
        local_d0 = *plVar5;
        local_e0 = (long *)*puVar6;
      }
      local_d8 = puVar6[1];
      *puVar6 = plVar5;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_e0);
    }
    puVar8 = (ulong *)(plVar5 + 2);
    if ((ulong *)*plVar5 == puVar8) {
      local_b0 = *puVar8;
      lStack_a8 = plVar5[3];
      local_c0 = &local_b0;
    }
    else {
      local_b0 = *puVar8;
      local_c0 = (ulong *)*plVar5;
    }
    local_b8 = plVar5[1];
    *plVar5 = (long)puVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::string::operator=((string *)local_80,(string *)&local_c0);
    if (local_c0 != &local_b0) {
      operator_delete(local_c0,local_b0 + 1);
    }
    if (local_e0 != &local_d0) {
      operator_delete(local_e0,local_d0 + 1);
    }
    if (local_a0[0] != local_90) {
      operator_delete(local_a0[0],local_90[0] + 1);
    }
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_80);
    if (local_80 != (undefined1  [8])local_70) {
      operator_delete((void *)local_80,CONCAT71(local_70._1_7_,local_70[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_p != &local_40) {
      operator_delete(local_50._M_p,local_40._M_allocated_capacity + 1);
    }
  }
  else {
    *(pointer *)__return_storage_ptr__ = local_58;
    paVar1 = &(__return_storage_ptr__->m_message).field_2;
    (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)paVar1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_p == &local_40) {
      paVar1->_M_allocated_capacity = local_40._M_allocated_capacity;
      *(undefined8 *)((long)&(__return_storage_ptr__->m_message).field_2 + 8) = local_40._8_8_;
    }
    else {
      (__return_storage_ptr__->m_message)._M_dataplus._M_p = local_50._M_p;
      (__return_storage_ptr__->m_message).field_2._M_allocated_capacity =
           local_40._M_allocated_capacity;
    }
    (__return_storage_ptr__->m_message)._M_string_length = local_48;
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateLoopContinueBreakLayer(const Specification::NeuralNetworkLayer& layer) {
    Result r;
    r = validateInputCount(layer, 0, 0);
    if (r.good()) {
        r = validateOutputCount(layer, 0, 0);
    }
    if (!r.good()) {
        return r;
    }

    if (loopStackDepth == 0) {
        std::string err;
        if (layer.layer_case() == Specification::NeuralNetworkLayer::LayerCase::kLoopBreak) {
            err = "Loop Break Layer '" + std::string(layer.name()) + "' must be inside the bodyNetwork of a loop layer.";
        } else {
            err = "Loop Continue Layer '" + std::string(layer.name()) + "' must be inside the bodyNetwork of a loop layer.";
        }
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }

    return r;
}